

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void btSolveL1(btScalar *L,btScalar *B,int n,int lskip1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  btScalar *pbVar17;
  btScalar *pbVar18;
  btScalar *pbVar19;
  btScalar *pbVar20;
  btScalar *pbVar21;
  long lVar22;
  float *pfVar23;
  float *pfVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  btScalar *pbVar30;
  btScalar *pbVar31;
  ulong uVar32;
  btScalar *pbVar33;
  btScalar *pbVar34;
  btScalar *pbVar35;
  btScalar *pbVar36;
  btScalar *pbVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  int local_174;
  btScalar *local_168;
  btScalar *local_160;
  btScalar *local_158;
  btScalar *local_150;
  btScalar *local_148;
  btScalar *local_140;
  btScalar *local_138;
  btScalar *local_130;
  btScalar *local_128;
  btScalar *local_120;
  btScalar *local_118;
  btScalar *local_110;
  btScalar *local_108;
  btScalar *local_100;
  btScalar *local_c0;
  btScalar *local_b8;
  btScalar *local_a8;
  btScalar *local_a0;
  btScalar *local_98;
  
  uVar15 = 0;
  if (3 < n) {
    iVar28 = lskip1 * 3;
    lVar16 = (long)(lskip1 * 2);
    iVar13 = lskip1 * 3 + 1;
    iVar14 = lskip1 * 3 + 2;
    lVar29 = (long)lskip1;
    pbVar20 = L + (lskip1 + 1);
    pbVar21 = L + (lskip1 + 2);
    local_c0 = L + (long)(lskip1 * 2 + 2) + 1;
    local_98 = L + (lskip1 + 3);
    local_a0 = L + (lskip1 * 3 + 3);
    local_a8 = L + (lskip1 + 4);
    pbVar33 = L + (long)(lskip1 * 2 + 4) + 1;
    pbVar37 = L + (lskip1 * 3 + 4);
    local_100 = L + (lskip1 + 5);
    pbVar31 = L + (lskip1 * 3 + 5);
    local_108 = L + (lskip1 + 6);
    pbVar36 = L + (long)(lskip1 * 2 + 6) + 1;
    local_110 = L + (lskip1 * 3 + 6);
    local_118 = L + (lskip1 + 7);
    local_120 = L + (lskip1 * 3 + 7);
    local_128 = L + (lskip1 + 8);
    pbVar18 = L + (long)(lskip1 * 2 + 8) + 1;
    local_130 = L + (lskip1 * 3 + 8);
    local_138 = L + (lskip1 + 9);
    local_140 = L + (lskip1 * 3 + 9);
    local_148 = L + (lskip1 + 10);
    pbVar19 = L + (long)(lskip1 * 2 + 10) + 1;
    local_150 = L + (lskip1 * 3 + 10);
    local_158 = L + (lskip1 + 0xb);
    local_160 = L + (lskip1 * 3 + 0xb);
    local_168 = L + lVar29;
    pbVar17 = L + lVar16 + 1;
    pbVar34 = L + iVar28;
    pbVar30 = L + iVar13;
    local_b8 = L + iVar14;
    local_174 = 0xc;
    uVar15 = 0;
    pbVar35 = L;
    do {
      if (uVar15 < 0xc) {
        pfVar24 = L + uVar15 * lVar29;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        iVar26 = (int)uVar15;
        pfVar23 = B;
      }
      else {
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        lVar22 = 0;
        iVar25 = local_174;
        do {
          iVar26 = iVar25;
          fVar1 = *(float *)((long)B + lVar22);
          fVar2 = *(float *)((long)B + lVar22 + 4);
          fVar3 = *(float *)((long)B + lVar22 + 8);
          fVar4 = *(float *)((long)B + lVar22 + 0xc);
          fVar5 = *(float *)((long)B + lVar22 + 0x10);
          fVar6 = *(float *)((long)B + lVar22 + 0x14);
          fVar7 = *(float *)((long)B + lVar22 + 0x18);
          fVar8 = *(float *)((long)B + lVar22 + 0x1c);
          fVar9 = *(float *)((long)B + lVar22 + 0x20);
          fVar10 = *(float *)((long)B + lVar22 + 0x24);
          fVar11 = *(float *)((long)B + lVar22 + 0x28);
          fVar12 = *(float *)((long)B + lVar22 + 0x2c);
          fVar38 = fVar12 * *(float *)((long)pbVar19 + lVar22) +
                   fVar11 * *(float *)((long)pbVar19 + lVar22 + -4) +
                   fVar10 * *(float *)((long)pbVar18 + lVar22) +
                   fVar9 * *(float *)((long)pbVar18 + lVar22 + -4) +
                   fVar8 * *(float *)((long)pbVar36 + lVar22) +
                   fVar7 * *(float *)((long)pbVar36 + lVar22 + -4) +
                   fVar6 * *(float *)((long)pbVar33 + lVar22) +
                   fVar5 * *(float *)((long)pbVar33 + lVar22 + -4) +
                   fVar4 * *(float *)((long)local_c0 + lVar22) +
                   fVar3 * *(float *)((long)local_c0 + lVar22 + -4) +
                   fVar2 * *(float *)((long)pbVar17 + lVar22) +
                   fVar1 * *(float *)((long)pbVar17 + lVar22 + -4) + fVar38;
          fVar39 = fVar12 * *(float *)((long)local_160 + lVar22) +
                   fVar11 * *(float *)((long)local_150 + lVar22) +
                   fVar10 * *(float *)((long)local_140 + lVar22) +
                   fVar9 * *(float *)((long)local_130 + lVar22) +
                   fVar8 * *(float *)((long)local_120 + lVar22) +
                   fVar7 * *(float *)((long)local_110 + lVar22) +
                   fVar6 * *(float *)((long)pbVar31 + lVar22) +
                   fVar5 * *(float *)((long)pbVar37 + lVar22) +
                   fVar4 * *(float *)((long)local_a0 + lVar22) +
                   fVar3 * *(float *)((long)local_b8 + lVar22) +
                   fVar2 * *(float *)((long)pbVar30 + lVar22) +
                   fVar1 * *(float *)((long)pbVar34 + lVar22) + fVar39;
          fVar40 = fVar12 * *(float *)((long)local_158 + lVar22) +
                   fVar11 * *(float *)((long)local_148 + lVar22) +
                   fVar10 * *(float *)((long)local_138 + lVar22) +
                   fVar9 * *(float *)((long)local_128 + lVar22) +
                   fVar8 * *(float *)((long)local_118 + lVar22) +
                   fVar7 * *(float *)((long)local_108 + lVar22) +
                   fVar6 * *(float *)((long)local_100 + lVar22) +
                   fVar5 * *(float *)((long)local_a8 + lVar22) +
                   fVar4 * *(float *)((long)local_98 + lVar22) +
                   fVar3 * *(float *)((long)pbVar21 + lVar22) +
                   fVar2 * *(float *)((long)pbVar20 + lVar22) +
                   fVar1 * *(float *)((long)local_168 + lVar22) + fVar40;
          fVar41 = fVar12 * *(float *)((long)pbVar35 + lVar22 + 0x2c) +
                   fVar11 * *(float *)((long)pbVar35 + lVar22 + 0x28) +
                   fVar10 * *(float *)((long)pbVar35 + lVar22 + 0x24) +
                   fVar9 * *(float *)((long)pbVar35 + lVar22 + 0x20) +
                   fVar8 * *(float *)((long)pbVar35 + lVar22 + 0x1c) +
                   fVar7 * *(float *)((long)pbVar35 + lVar22 + 0x18) +
                   fVar6 * *(float *)((long)pbVar35 + lVar22 + 0x14) +
                   fVar5 * *(float *)((long)pbVar35 + lVar22 + 0x10) +
                   fVar4 * *(float *)((long)pbVar35 + lVar22 + 0xc) +
                   fVar3 * *(float *)((long)pbVar35 + lVar22 + 8) +
                   fVar2 * *(float *)((long)pbVar35 + lVar22 + 4) +
                   fVar1 * *(float *)((long)pbVar35 + lVar22) + fVar41;
          iVar25 = iVar26 + -0xc;
          lVar22 = lVar22 + 0x30;
        } while (0x17 < iVar25);
        iVar26 = iVar26 + -0x18;
        pfVar24 = (float *)((long)pbVar35 + lVar22);
        pfVar23 = (float *)(lVar22 + (long)B);
      }
      if (0 < iVar26) {
        iVar26 = iVar26 + 1;
        do {
          fVar1 = *pfVar23;
          fVar38 = fVar38 + fVar1 * pfVar24[lVar16];
          fVar39 = fVar39 + fVar1 * pfVar24[iVar28];
          fVar40 = fVar40 + fVar1 * pfVar24[lVar29];
          fVar41 = fVar41 + fVar1 * *pfVar24;
          pfVar24 = pfVar24 + 1;
          pfVar23 = pfVar23 + 1;
          iVar26 = iVar26 + -1;
        } while (1 < iVar26);
      }
      fVar41 = *pfVar23 - fVar41;
      *pfVar23 = fVar41;
      fVar40 = (pfVar23[1] - fVar40) - pfVar24[lVar29] * fVar41;
      pfVar23[1] = fVar40;
      fVar38 = ((pfVar23[2] - fVar38) - pfVar24[lVar16] * fVar41) - pfVar24[lskip1 * 2 + 1] * fVar40
      ;
      pfVar23[2] = fVar38;
      pfVar23[3] = (((pfVar23[3] - fVar39) - fVar41 * pfVar24[iVar28]) - fVar40 * pfVar24[iVar13]) -
                   fVar38 * pfVar24[iVar14];
      uVar15 = uVar15 + 4;
      local_174 = local_174 + 4;
      local_168 = local_168 + lVar29 * 4;
      pbVar17 = pbVar17 + lVar29 * 4;
      pbVar34 = pbVar34 + lVar29 * 4;
      pbVar20 = pbVar20 + lVar29 * 4;
      pbVar30 = pbVar30 + lVar29 * 4;
      pbVar21 = pbVar21 + lVar29 * 4;
      local_c0 = local_c0 + lVar29 * 4;
      local_b8 = local_b8 + lVar29 * 4;
      local_98 = local_98 + lVar29 * 4;
      local_a0 = local_a0 + lVar29 * 4;
      local_a8 = local_a8 + lVar29 * 4;
      pbVar33 = pbVar33 + lVar29 * 4;
      pbVar37 = pbVar37 + lVar29 * 4;
      local_100 = local_100 + lVar29 * 4;
      pbVar31 = pbVar31 + lVar29 * 4;
      local_108 = local_108 + lVar29 * 4;
      pbVar36 = pbVar36 + lVar29 * 4;
      local_110 = local_110 + lVar29 * 4;
      local_118 = local_118 + lVar29 * 4;
      local_120 = local_120 + lVar29 * 4;
      local_128 = local_128 + lVar29 * 4;
      pbVar18 = pbVar18 + lVar29 * 4;
      local_130 = local_130 + lVar29 * 4;
      local_138 = local_138 + lVar29 * 4;
      local_140 = local_140 + lVar29 * 4;
      local_148 = local_148 + lVar29 * 4;
      pbVar19 = pbVar19 + lVar29 * 4;
      local_150 = local_150 + lVar29 * 4;
      local_158 = local_158 + lVar29 * 4;
      local_160 = local_160 + lVar29 * 4;
      pbVar35 = pbVar35 + lVar29 * 4;
    } while ((long)uVar15 <= (long)(n + -4));
  }
  if ((int)uVar15 < n) {
    uVar15 = uVar15 & 0xffffffff;
    do {
      pfVar24 = L + uVar15 * (long)lskip1;
      fVar38 = 0.0;
      uVar27 = (uint)uVar15;
      pbVar20 = B;
      if (0xb < uVar15) {
        uVar32 = uVar15 & 0xffffffff;
        do {
          iVar28 = (int)uVar32;
          uVar27 = iVar28 - 0xc;
          fVar38 = pfVar24[0xb] * pbVar20[0xb] +
                   pfVar24[10] * pbVar20[10] +
                   pfVar24[9] * pbVar20[9] +
                   pfVar24[8] * pbVar20[8] +
                   pfVar24[7] * pbVar20[7] +
                   pfVar24[6] * pbVar20[6] +
                   pfVar24[5] * pbVar20[5] +
                   pfVar24[4] * pbVar20[4] +
                   pfVar24[3] * pbVar20[3] +
                   pfVar24[2] * pbVar20[2] + pfVar24[1] * pbVar20[1] + *pfVar24 * *pbVar20 + fVar38;
          pfVar24 = pfVar24 + 0xc;
          pbVar20 = pbVar20 + 0xc;
          uVar32 = (ulong)uVar27;
        } while (0x17 < iVar28);
      }
      if (0 < (int)uVar27) {
        iVar28 = uVar27 + 1;
        do {
          fVar38 = fVar38 + *pfVar24 * *pbVar20;
          pfVar24 = pfVar24 + 1;
          pbVar20 = pbVar20 + 1;
          iVar28 = iVar28 + -1;
        } while (1 < iVar28);
      }
      *pbVar20 = *pbVar20 - fVar38;
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uint)n);
  }
  return;
}

Assistant:

void btSolveL1 (const btScalar *L, btScalar *B, int n, int lskip1)
{  
  /* declare variables - Z matrix, p and q vectors, etc */
  btScalar Z11,Z21,Z31,Z41,p1,q1,p2,p3,p4,*ex;
  const btScalar *ell;
  int lskip2,lskip3,i,j;
  /* compute lskip values */
  lskip2 = 2*lskip1;
  lskip3 = 3*lskip1;
  /* compute all 4 x 1 blocks of X */
  for (i=0; i <= n-4; i+=4) {
    /* compute all 4 x 1 block of X, from rows i..i+4-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    Z21=0;
    Z31=0;
    Z41=0;
    ell = L + i*lskip1;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-12; j >= 0; j -= 12) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[lskip1];
      p3=ell[lskip2];
      p4=ell[lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[1];
      q1=ex[1];
      p2=ell[1+lskip1];
      p3=ell[1+lskip2];
      p4=ell[1+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[2];
      q1=ex[2];
      p2=ell[2+lskip1];
      p3=ell[2+lskip2];
      p4=ell[2+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[3];
      q1=ex[3];
      p2=ell[3+lskip1];
      p3=ell[3+lskip2];
      p4=ell[3+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[4];
      q1=ex[4];
      p2=ell[4+lskip1];
      p3=ell[4+lskip2];
      p4=ell[4+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[5];
      q1=ex[5];
      p2=ell[5+lskip1];
      p3=ell[5+lskip2];
      p4=ell[5+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[6];
      q1=ex[6];
      p2=ell[6+lskip1];
      p3=ell[6+lskip2];
      p4=ell[6+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[7];
      q1=ex[7];
      p2=ell[7+lskip1];
      p3=ell[7+lskip2];
      p4=ell[7+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[8];
      q1=ex[8];
      p2=ell[8+lskip1];
      p3=ell[8+lskip2];
      p4=ell[8+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[9];
      q1=ex[9];
      p2=ell[9+lskip1];
      p3=ell[9+lskip2];
      p4=ell[9+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[10];
      q1=ex[10];
      p2=ell[10+lskip1];
      p3=ell[10+lskip2];
      p4=ell[10+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[11];
      q1=ex[11];
      p2=ell[11+lskip1];
      p3=ell[11+lskip2];
      p4=ell[11+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* advance pointers */
      ell += 12;
      ex += 12;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 12;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[lskip1];
      p3=ell[lskip2];
      p4=ell[lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* advance pointers */
      ell += 1;
      ex += 1;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
    p1 = ell[lskip1];
    Z21 = ex[1] - Z21 - p1*Z11;
    ex[1] = Z21;
    p1 = ell[lskip2];
    p2 = ell[1+lskip2];
    Z31 = ex[2] - Z31 - p1*Z11 - p2*Z21;
    ex[2] = Z31;
    p1 = ell[lskip3];
    p2 = ell[1+lskip3];
    p3 = ell[2+lskip3];
    Z41 = ex[3] - Z41 - p1*Z11 - p2*Z21 - p3*Z31;
    ex[3] = Z41;
    /* end of outer loop */
  }
  /* compute rows at end that are not a multiple of block size */
  for (; i < n; i++) {
    /* compute all 1 x 1 block of X, from rows i..i+1-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    ell = L + i*lskip1;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-12; j >= 0; j -= 12) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[1];
      q1=ex[1];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[2];
      q1=ex[2];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[3];
      q1=ex[3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[4];
      q1=ex[4];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[5];
      q1=ex[5];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[6];
      q1=ex[6];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[7];
      q1=ex[7];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[8];
      q1=ex[8];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[9];
      q1=ex[9];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[10];
      q1=ex[10];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[11];
      q1=ex[11];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* advance pointers */
      ell += 12;
      ex += 12;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 12;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* advance pointers */
      ell += 1;
      ex += 1;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
  }
}